

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O3

isobusfs_error linux_error_to_isobusfs_error(int linux_err)

{
  if (linux_err < -0x26) {
    if (linux_err == -0x5a) {
      return ISOBUSFS_ERR_INVALID_REQUESTED_LENGHT;
    }
    if (linux_err == -0x54) {
      return ISOBUSFS_ERR_MALFORMED_REQUEST;
    }
    if (linux_err == -0x47) {
      return ISOBUSFS_ERR_TAN_ERR;
    }
  }
  else {
    switch(linux_err) {
    case 0:
      return linux_err;
    case -0x26:
      return ISOBUSFS_ERR_FUNC_NOT_SUPPORTED;
    case -0x24:
      return ISOBUSFS_ERR_INVALID_SRC_NAME;
    case -0x1e:
      return ISOBUSFS_ERR_VOLUME_NOT_INITIALIZED;
    case -0x1d:
      return ISOBUSFS_ERR_END_OF_FILE;
    case -0x1c:
      return ISOBUSFS_ERR_NO_SPACE;
    case -0x18:
      return ISOBUSFS_ERR_TOO_MANY_FILES_OPEN;
    case -0x16:
      return ISOBUSFS_ERR_INVALID_DST_NAME;
    case -0x14:
      return ISOBUSFS_ERR_INVALID_ACCESS;
    case -0x13:
      return ISOBUSFS_ERR_MEDIA_IS_NOT_PRESENT;
    case -0xe:
      return ISOBUSFS_ERR_ON_READ;
    case -0xd:
      return ISOBUSFS_ERR_ACCESS_DENIED;
    case -0xc:
      return ISOBUSFS_ERR_OUT_OF_MEM;
    case -9:
      return ISOBUSFS_ERR_INVALID_HANDLE;
    case -5:
      return ISOBUSFS_ERR_ON_WRITE;
    case -2:
      return ISOBUSFS_ERR_FILE_ORPATH_NOT_FOUND;
    }
  }
  return ISOBUSFS_ERR_OTHER;
}

Assistant:

enum isobusfs_error linux_error_to_isobusfs_error(int linux_err)
{
	switch (linux_err) {
	case 0:
		return ISOBUSFS_ERR_SUCCESS;
	case -EINVAL:
		return ISOBUSFS_ERR_INVALID_DST_NAME;
	case -EACCES:
		return ISOBUSFS_ERR_ACCESS_DENIED;
	case -ENOTDIR:
		return ISOBUSFS_ERR_INVALID_ACCESS;
	case -EMFILE:
		return ISOBUSFS_ERR_TOO_MANY_FILES_OPEN;
	case -ENOENT:
		return ISOBUSFS_ERR_FILE_ORPATH_NOT_FOUND;
	case -EBADF:
		return ISOBUSFS_ERR_INVALID_HANDLE;
	case -ENAMETOOLONG:
		return ISOBUSFS_ERR_INVALID_SRC_NAME;
	case -ENOSPC:
		return ISOBUSFS_ERR_NO_SPACE;
	case -EIO:
		return ISOBUSFS_ERR_ON_WRITE;
	case -ENODEV:
		return ISOBUSFS_ERR_MEDIA_IS_NOT_PRESENT;
	case -EROFS:
		return ISOBUSFS_ERR_VOLUME_NOT_INITIALIZED;
	case -EFAULT:
		return ISOBUSFS_ERR_ON_READ;
	case -ENOSYS:
		return ISOBUSFS_ERR_FUNC_NOT_SUPPORTED;
	case -EMSGSIZE:
		return ISOBUSFS_ERR_INVALID_REQUESTED_LENGHT;
	case -ENOMEM:
		return ISOBUSFS_ERR_OUT_OF_MEM;
	case -EPERM:
		return ISOBUSFS_ERR_OTHER;
	case -ESPIPE:
		return ISOBUSFS_ERR_END_OF_FILE;
	case -EPROTO:
		return ISOBUSFS_ERR_TAN_ERR;
	case -EILSEQ:
		return ISOBUSFS_ERR_MALFORMED_REQUEST;
	default:
		return ISOBUSFS_ERR_OTHER;
	}
}